

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O0

void __thiscall mdsplit::mdsplitter::generate_navigation_files(mdsplitter *this)

{
  _List this_00;
  bool bVar1;
  value_type *pvVar2;
  reference this_01;
  size_type sVar3;
  reference pvVar4;
  reference __in;
  type *__p;
  istream *piVar5;
  const_reference __rhs;
  ulong uVar6;
  ostream *poVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  reference pbVar9;
  bool local_83a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  const_iterator __end3;
  const_iterator __begin3;
  type *__range3;
  ofstream fout;
  ulong local_600;
  size_t i_1;
  size_t content_idx;
  string current_line;
  ifstream local_5c8 [7];
  bool has_changed;
  ifstream fin;
  undefined1 local_3c0 [8];
  path pages_file;
  type *content;
  type *p_1;
  _Self local_380;
  iterator __end1;
  iterator __begin1;
  map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1;
  path local_340;
  path local_318;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  path local_270;
  undefined1 local_248 [8];
  path grand_path;
  path local_1f8;
  value_type *local_1d0;
  size_t j;
  undefined1 local_1c0 [7];
  bool is_first;
  undefined1 local_191;
  undefined1 local_190 [7];
  bool is_a_new_directory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  byte local_10a;
  allocator<char> local_109;
  undefined1 local_108 [8];
  string sidebar_name;
  undefined1 local_e0 [7];
  bool has_children;
  path f;
  path p;
  value_type *section;
  size_t i;
  undefined1 local_70 [8];
  path previous_path;
  anon_class_8_1_834c233f add_content;
  map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  navigations;
  mdsplitter *this_local;
  
  std::
  map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)&add_content);
  previous_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )&add_content;
  std::filesystem::__cxx11::path::path((path *)local_70,&this->output_dir_);
  section = (value_type *)0x0;
  do {
    pvVar2 = (value_type *)
             std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::size
                       (&this->sections_);
    if (pvVar2 <= section) {
      __end1 = std::
               map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::begin((map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&add_content);
      local_380._M_node =
           (_Base_ptr)
           std::
           map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)&add_content);
      do {
        bVar1 = std::operator!=(&__end1,&local_380);
        if (!bVar1) {
          std::filesystem::__cxx11::path::~path((path *)local_70);
          std::
          map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~map((map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)&add_content);
          return;
        }
        __in = std::
               _Rb_tree_iterator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
        __p = std::
              get<0ul,std::filesystem::__cxx11::path_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (__in);
        pages_file._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )std::
               get<1ul,std::filesystem::__cxx11::path_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (__in);
        std::filesystem::__cxx11::path::path((path *)local_3c0,__p);
        std::filesystem::__cxx11::path::operator/=((path *)local_3c0,(char (*) [7])".pages");
        std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                  (local_5c8,(path *)local_3c0,_S_in);
        current_line.field_2._M_local_buf[0xf] = '\0';
        std::__cxx11::string::string((string *)&content_idx);
        i_1 = 0;
        do {
          while( true ) {
            piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_5c8,(string *)&content_idx);
            bVar1 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
            if (!bVar1) goto LAB_0015c537;
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)pages_file._M_cmpts._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              ._M_head_impl);
            if (sVar3 <= i_1) break;
            __rhs = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)pages_file._M_cmpts._M_impl._M_t.
                                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                    .
                                    super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                    ._M_head_impl,i_1);
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&content_idx,__rhs);
            if (bVar1) {
              current_line.field_2._M_local_buf[0xf] = '\x01';
              goto LAB_0015c537;
            }
            i_1 = i_1 + 1;
          }
          uVar6 = std::__cxx11::string::empty();
        } while ((uVar6 & 1) != 0);
        current_line.field_2._M_local_buf[0xf] = '\x01';
LAB_0015c537:
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pages_file._M_cmpts._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl);
        if (i_1 < sVar3) {
          for (local_600 = i_1;
              sVar3 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)pages_file._M_cmpts._M_impl._M_t.
                                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                .
                                super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                ._M_head_impl), local_600 < sVar3; local_600 = local_600 + 1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)pages_file._M_cmpts._M_impl._M_t.
                            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            .
                            super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                            ._M_head_impl,local_600);
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              current_line.field_2._M_local_buf[0xf] = '\x01';
            }
          }
        }
        if ((current_line.field_2._M_local_buf[0xf] & 1U) == 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"File ");
          pbVar8 = std::filesystem::__cxx11::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)poVar7,
                              (path *)local_3c0);
          poVar7 = std::operator<<((ostream *)pbVar8," has not changed ");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        if ((current_line.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                    ((ofstream *)&__range3,(path *)local_3c0,_S_out);
          poVar7 = std::operator<<((ostream *)&std::cout,"Saving ");
          pbVar8 = std::filesystem::__cxx11::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)poVar7,
                              (path *)local_3c0);
          std::ostream::operator<<((ostream *)pbVar8,std::endl<char,std::char_traits<char>>);
          this_00 = pages_file._M_cmpts;
          __end3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)pages_file._M_cmpts._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              ._M_head_impl);
          line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_00._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&line), bVar1) {
            pbVar9 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end3);
            poVar7 = std::operator<<((ostream *)&__range3,(string *)pbVar9);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
          std::ofstream::~ofstream(&__range3);
        }
        std::__cxx11::string::~string((string *)&content_idx);
        std::ifstream::~ifstream(local_5c8);
        std::filesystem::__cxx11::path::~path((path *)local_3c0);
        std::
        _Rb_tree_iterator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&__end1);
      } while( true );
    }
    this_01 = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::operator[]
                        (&this->sections_,(size_type)section);
    bVar1 = mdsection::has_content(this_01,false,false);
    if (bVar1) {
      std::filesystem::__cxx11::path::parent_path();
      std::filesystem::__cxx11::path::filename((path *)local_e0,&this_01->filepath);
      local_83a = false;
      if (this_01->level != 1) {
        sVar3 = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::size
                          (&this->sections_);
        local_83a = false;
        if (section < (value_type *)(sVar3 - 1)) {
          pvVar4 = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::operator[]
                             (&this->sections_,(size_type)((long)&section->level + 1));
          local_83a = this_01->level < pvVar4->level;
        }
      }
      sidebar_name.field_2._M_local_buf[0xf] = local_83a;
      local_10a = 0;
      if (local_83a == false) {
        std::__cxx11::string::string((string *)local_108,(string *)&this_01->header_name);
      }
      else {
        std::allocator<char>::allocator();
        local_10a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_108,"Introduction",&local_109);
      }
      if ((local_10a & 1) != 0) {
        std::allocator<char>::~allocator(&local_109);
      }
      std::operator+(&local_170,"  - ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      std::operator+(&local_150,&local_170,": ");
      std::filesystem::__cxx11::path::string((string *)local_190,(path *)local_e0);
      std::operator+(&local_130,&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
      ;
      generate_navigation_files::anon_class_8_1_834c233f::operator()
                ((anon_class_8_1_834c233f *)&previous_path._M_cmpts,(path *)&f._M_cmpts,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)local_108);
      std::filesystem::__cxx11::path::~path((path *)local_e0);
      std::filesystem::__cxx11::path::~path((path *)&f._M_cmpts);
    }
    std::filesystem::__cxx11::path::parent_path();
    bVar1 = std::filesystem::__cxx11::operator!=((path *)local_1c0,(path *)local_70);
    std::filesystem::__cxx11::path::~path((path *)local_1c0);
    local_191 = bVar1;
    if (bVar1) {
      j._7_1_ = 1;
      for (local_1d0 = (value_type *)0x0; local_1d0 < section;
          local_1d0 = (value_type *)((long)&local_1d0->level + 1)) {
        std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::operator[]
                  (&this->sections_,(size_type)local_1d0);
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::parent_path();
        bVar1 = std::filesystem::__cxx11::operator==(&local_1f8,(path *)&grand_path._M_cmpts);
        std::filesystem::__cxx11::path::~path((path *)&grand_path._M_cmpts);
        std::filesystem::__cxx11::path::~path(&local_1f8);
        if (bVar1) {
          j._7_1_ = 0;
          break;
        }
      }
      if ((j._7_1_ & 1) != 0) {
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::~path(&local_270);
        std::operator+(&local_2d0,"  - ",&this_01->header_name);
        std::operator+(&local_2b0,&local_2d0,": ");
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::relative(&local_318,&local_340);
        std::filesystem::__cxx11::path::string(&local_2f0,&local_318);
        std::operator+(&local_290,&local_2b0,&local_2f0);
        generate_navigation_files::anon_class_8_1_834c233f::operator()
                  ((anon_class_8_1_834c233f *)&previous_path._M_cmpts,(path *)local_248,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::filesystem::__cxx11::path::~path(&local_318);
        std::filesystem::__cxx11::path::~path(&local_340);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::filesystem::__cxx11::path::~path((path *)local_248);
      }
    }
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::__cxx11::path::operator=((path *)local_70,(path *)&__range1);
    std::filesystem::__cxx11::path::~path((path *)&__range1);
    section = (value_type *)((long)&section->level + 1);
  } while( true );
}

Assistant:

void mdsplitter::generate_navigation_files() {
        // path -> navigation items in the path
        using navigation_content = std::vector<std::string>;
        std::map<fs::path, navigation_content> navigations;

        // function to add content to these files
        auto add_content = [&](const fs::path &p, const std::string &line) {
            auto it = navigations.find(p);
            if (it == navigations.end()) {
                navigations[p] = {"nav:", line};
            } else {
                navigations[p].emplace_back(line);
            }
        };

        // Add sections in all relevant navigation files
        fs::path previous_path = output_dir_;
        for (size_t i = 0; i < sections_.size(); ++i) {
            // Add file to its own navigation pages (if there's content)
            auto &section = sections_[i];
            if (section.has_content()) {
                fs::path p = section.filepath.parent_path();
                fs::path f = section.filepath.filename();
                bool has_children = section.level != 1 &&
                                    i < sections_.size() - 1 &&
                                    sections_[i + 1].level > section.level;
                std::string sidebar_name =
                    has_children ? "Introduction" : section.header_name;
                add_content(p, "  - " + sidebar_name + ": " + f.string());
            }

            // Add file to the parent navigation pages (if it's first in this
            // directory)
            bool is_a_new_directory =
                section.filepath.parent_path() != previous_path;
            if (is_a_new_directory) {
                // check if this is the first file in this dir
                bool is_first = true;
                for (size_t j = 0; j < i; ++j) {
                    if (sections_[j].filepath.parent_path() ==
                        section.filepath.parent_path()) {
                        is_first = false;
                        break;
                    }
                }

                // if it's first file in this dir
                if (is_first) {
                    // put it in the parent path navigation list too
                    fs::path grand_path =
                        section.filepath.parent_path().parent_path();
                    add_content(grand_path,
                                "  - " + section.header_name + ": " +
                                    fs::relative(section.filepath.parent_path(),
                                                 grand_path)
                                        .string());
                }
            }
            previous_path = section.filepath.parent_path();
        }

        // Save the .pages
        for (const auto &[p, content] : navigations) {
            fs::path pages_file = p;
            pages_file /= ".pages";

            // Check if file has changed
            std::ifstream fin(pages_file);
            bool has_changed = false;
            std::string current_line;
            size_t content_idx = 0;
            while (std::getline(fin, current_line)) {
                if (content_idx < content.size()) {
                    if (current_line != content[content_idx]) {
                        has_changed = true;
                        break;
                    }
                    ++content_idx;
                } else {
                    if (!current_line.empty()) {
                        has_changed = true;
                        break;
                    }
                }
            }
            if (content_idx < content.size()) {
                for (size_t i = content_idx; i < content.size(); ++i) {
                    if (!content[i].empty()) {
                        has_changed = true;
                    }
                }
            }

            if (!has_changed) {
                std::cout << "File " << pages_file << " has not changed "
                          << std::endl;
            }

            // Save file if its contents have changed
            if (has_changed) {
                std::ofstream fout(pages_file);
                std::cout << "Saving " << pages_file << std::endl;
                for (const auto &line : content) {
                    fout << line << std::endl;
                }
            }
        }
    }